

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

void __thiscall
icu_63::LookAheadResults::setPosition(LookAheadResults *this,int16_t key,int32_t position)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)this->fUsedSlotLimit;
  if (this->fUsedSlotLimit < 1) {
    uVar1 = uVar2;
  }
  while( true ) {
    if (uVar1 == uVar2) {
      uVar2 = 7;
      if ((uint)uVar1 < 7) {
        uVar2 = uVar1;
      }
      this->fKeys[uVar2] = key;
      this->fPositions[uVar2] = position;
      this->fUsedSlotLimit = (int)uVar2 + 1;
      return;
    }
    if (this->fKeys[uVar2] == key) break;
    uVar2 = uVar2 + 1;
  }
  this->fPositions[uVar2] = position;
  return;
}

Assistant:

void setPosition(int16_t key, int32_t position) {
        int32_t i;
        for (i=0; i<fUsedSlotLimit; ++i) {
            if (fKeys[i] == key) {
                fPositions[i] = position;
                return;
            }
        }
        if (i >= kMaxLookaheads) {
            U_ASSERT(FALSE);
            i = kMaxLookaheads - 1;
        }
        fKeys[i] = key;
        fPositions[i] = position;
        U_ASSERT(fUsedSlotLimit == i);
        fUsedSlotLimit = i + 1;
    }